

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O0

REF_STATUS ref_matrix_show_ab(REF_INT rows,REF_INT cols,REF_DBL *ab)

{
  int local_20;
  int local_1c;
  REF_INT col;
  REF_INT row;
  REF_DBL *ab_local;
  REF_INT cols_local;
  REF_INT rows_local;
  
  for (local_1c = 0; local_1c < rows; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < cols; local_20 = local_20 + 1) {
      printf("%12.4e",ab[local_1c + rows * local_20]);
      if (local_20 < cols + -1) {
        printf(" ");
      }
      if (local_20 == rows + -1) {
        printf("| ");
      }
    }
    printf("\n");
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_ab(REF_INT rows, REF_INT cols, REF_DBL *ab) {
  REF_INT row, col;

  for (row = 0; row < rows; row++) {
    for (col = 0; col < cols; col++) {
      printf("%12.4e", ab[row + rows * col]);
      if (col < cols - 1) printf(" ");
      if (col == rows - 1) printf("| ");
    }
    printf("\n");
  }
  return REF_SUCCESS;
}